

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall
SampleDiscrete_VsPiecewiseConstant1D_Test::~SampleDiscrete_VsPiecewiseConstant1D_Test
          (SampleDiscrete_VsPiecewiseConstant1D_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SampleDiscrete, VsPiecewiseConstant1D) {
    std::vector<Float> values;
    RNG rng;
    for (int i = 0; i < 15; ++i)
        values.push_back(std::max<Float>(0, rng.Uniform<Float>() - .2f));

    PiecewiseConstant1D dist(values);

    for (int i = 0; i < 100; ++i) {
        Float u = rng.Uniform<Float>();
        Float sdPDF;
        int sdIndex = SampleDiscrete(values, u, &sdPDF);

        Float pcPDF;
        Float pcOffset = dist.Sample(u, &pcPDF);
        int pcIndex = int(pcOffset * values.size());
        pcPDF /= values.size();

        EXPECT_EQ(sdIndex, pcIndex) << u;
        EXPECT_LT(std::abs(sdPDF - pcPDF), 1e-3) << u;
    }
}